

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsOptions.cpp
# Opt level: O3

OptionStatus
checkOptionValue(HighsLogOptions *report_log_options,OptionRecordString *option,string *value)

{
  size_t __n;
  bool bVar1;
  int iVar2;
  string *name;
  
  __n = (option->super_OptionRecord).name._M_string_length;
  name = &(option->super_OptionRecord).name;
  if ((__n == kPresolveString_abi_cxx11_._M_string_length) &&
     ((__n == 0 ||
      (iVar2 = bcmp((name->_M_dataplus)._M_p,kPresolveString_abi_cxx11_._M_dataplus._M_p,__n),
      iVar2 == 0)))) {
    bVar1 = commandLineOffChooseOnOk(report_log_options,name,value);
    if ((!bVar1) && (iVar2 = std::__cxx11::string::compare((char *)value), iVar2 != 0)) {
      return kIllegalValue;
    }
  }
  else {
    if ((__n == kSolverString_abi_cxx11_._M_string_length) &&
       ((__n == 0 ||
        (iVar2 = bcmp((name->_M_dataplus)._M_p,kSolverString_abi_cxx11_._M_dataplus._M_p,__n),
        iVar2 == 0)))) {
      bVar1 = commandLineSolverOk(report_log_options,value);
    }
    else if (((__n == kParallelString_abi_cxx11_._M_string_length) &&
             ((__n == 0 ||
              (iVar2 = bcmp((name->_M_dataplus)._M_p,kParallelString_abi_cxx11_._M_dataplus._M_p,__n
                           ), iVar2 == 0)))) ||
            ((__n == kRunCrossoverString_abi_cxx11_._M_string_length &&
             ((__n == 0 ||
              (iVar2 = bcmp((name->_M_dataplus)._M_p,kRunCrossoverString_abi_cxx11_._M_dataplus._M_p
                            ,__n), iVar2 == 0)))))) {
      bVar1 = commandLineOffChooseOnOk(report_log_options,name,value);
    }
    else {
      if (__n != kRangingString_abi_cxx11_._M_string_length) {
        return kOk;
      }
      if ((__n != 0) &&
         (iVar2 = bcmp((name->_M_dataplus)._M_p,kRangingString_abi_cxx11_._M_dataplus._M_p,__n),
         iVar2 != 0)) {
        return kOk;
      }
      bVar1 = commandLineOffOnOk(report_log_options,name,value);
    }
    if (bVar1 == false) {
      return kIllegalValue;
    }
  }
  return kOk;
}

Assistant:

OptionStatus checkOptionValue(const HighsLogOptions& report_log_options,
                              OptionRecordString& option,
                              const std::string value) {
  // Setting a string option. For some options only particular values
  // are permitted, so check them
  if (option.name == kPresolveString) {
    if (!commandLineOffChooseOnOk(report_log_options, option.name, value) &&
        value != "mip")
      return OptionStatus::kIllegalValue;
  } else if (option.name == kSolverString) {
    if (!commandLineSolverOk(report_log_options, value))
      return OptionStatus::kIllegalValue;
  } else if (option.name == kParallelString) {
    if (!commandLineOffChooseOnOk(report_log_options, option.name, value))
      return OptionStatus::kIllegalValue;
  } else if (option.name == kRunCrossoverString) {
    if (!commandLineOffChooseOnOk(report_log_options, option.name, value))
      return OptionStatus::kIllegalValue;
  } else if (option.name == kRangingString) {
    if (!commandLineOffOnOk(report_log_options, option.name, value))
      return OptionStatus::kIllegalValue;
  }
  return OptionStatus::kOk;
}